

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::
derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
::copy_to(derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
          *this,unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
                *dest)

{
  type val;
  unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  *in_RSI;
  long in_RDI;
  pointer in_stack_ffffffffffffffb8;
  derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
  *in_stack_ffffffffffffffe0;
  
  operator_new(0x50);
  val = any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul>::
        deref<dlib::member_function_pointer<dlib::vector<long,2l>const&,bool,unsigned_long,void>,dlib::member_function_pointer<dlib::vector<long,2l>const&,bool,unsigned_long,void>>
                  ((member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>
                    *)(in_RDI + 0x10));
  derived(in_stack_ffffffffffffffe0,val);
  std::
  unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  ::reset(in_RSI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
        A1 a1, A2 a2, A3 a3
    ) const { DLIB_ANY_FUNCTION_RETURN item(a1,a2,a3); }